

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar1 = v1->x;
  uVar4 = v1->y;
  fVar8 = v1->z;
  fVar7 = fVar8 * fVar8 + (float)uVar1 * (float)uVar1 + (float)uVar4 * (float)uVar4;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 | ~-(uint)(fVar7 == 0.0) & (uint)(1.0 / fVar7))
  ;
  fVar10 = (float)uVar1 * fVar7;
  fVar11 = (float)uVar4 * fVar7;
  fVar8 = fVar8 * fVar7;
  v1->x = fVar10;
  v1->y = fVar11;
  v1->z = fVar8;
  uVar2 = v2->x;
  uVar5 = v2->y;
  fVar9 = fVar11 * v2->z - fVar8 * (float)uVar5;
  fVar7 = fVar8 * (float)uVar2 - v2->z * fVar10;
  fVar10 = (float)uVar5 * fVar10 - fVar11 * (float)uVar2;
  fVar8 = fVar10 * fVar10 + fVar9 * fVar9 + fVar7 * fVar7;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar11 = (float)(-(uint)(fVar8 == 0.0) & 0x3f800000 | ~-(uint)(fVar8 == 0.0) & (uint)(1.0 / fVar8)
                  );
  uVar3 = v1->x;
  uVar6 = v1->y;
  fVar8 = v1->z;
  v2->x = fVar7 * fVar11 * fVar8 - fVar10 * fVar11 * (float)uVar6;
  v2->y = fVar10 * fVar11 * (float)uVar3 - fVar8 * fVar9 * fVar11;
  v2->z = (float)uVar6 * fVar9 * fVar11 - fVar7 * fVar11 * (float)uVar3;
  return;
}

Assistant:

RMDEF void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    *v1 = Vector3Normalize(*v1);
    Vector3 vn = Vector3CrossProduct(*v1, *v2);
    vn = Vector3Normalize(vn);
    *v2 = Vector3CrossProduct(vn, *v1);
}